

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

bool __thiscall Assimp::FileSystemFilter::Exists(FileSystemFilter *this,char *pFile)

{
  bool bVar1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string tmp;
  char *pFile_local;
  FileSystemFilter *this_local;
  
  tmp.field_2._8_8_ = pFile;
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                  ,0x67,"virtual bool Assimp::FileSystemFilter::Exists(const char *) const");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pFile,&local_39);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,&this->mSrc_file);
  if (bVar1) {
    BuildPath(this,(string *)local_38);
    Cleanup(this,(string *)local_38);
  }
  bVar1 = IOSystem::Exists(this->mWrapped,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool Exists( const char* pFile) const {
        ai_assert( nullptr != mWrapped );
        
        std::string tmp = pFile;

        // Currently this IOSystem is also used to open THE ONE FILE.
        if (tmp != mSrc_file)    {
            BuildPath(tmp);
            Cleanup(tmp);
        }

        return mWrapped->Exists(tmp);
    }